

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O1

void cff_decoder_init(CFF_Decoder *decoder,TT_Face face,CFF_Size size,CFF_GlyphSlot slot,
                     FT_Bool hinting,FT_Render_Mode hint_mode,
                     CFF_Decoder_Get_Glyph_Callback get_callback,
                     CFF_Decoder_Free_Glyph_Callback free_callback)

{
  uint uVar1;
  CFF_Font_conflict pCVar2;
  FT_Int FVar3;
  
  pCVar2 = (CFF_Font_conflict)(face->extra).data;
  FVar3 = 0;
  memset(decoder,0,0x5f0);
  cff_builder_init(&decoder->builder,face,size,slot,hinting);
  decoder->cff = pCVar2;
  uVar1 = (pCVar2->global_subrs_index).count;
  decoder->num_globals = uVar1;
  decoder->globals = pCVar2->global_subrs;
  if ((((pCVar2->top_font).font_dict.charstring_type != 1) && (FVar3 = 0x6b, 0x4d7 < uVar1)) &&
     (FVar3 = 0x8000, uVar1 < 0x846c)) {
    FVar3 = 0x46b;
  }
  decoder->globals_bias = FVar3;
  decoder->hint_mode = hint_mode;
  decoder->get_glyph_callback = get_callback;
  decoder->free_glyph_callback = free_callback;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_decoder_init( CFF_Decoder*                     decoder,
                    TT_Face                          face,
                    CFF_Size                         size,
                    CFF_GlyphSlot                    slot,
                    FT_Bool                          hinting,
                    FT_Render_Mode                   hint_mode,
                    CFF_Decoder_Get_Glyph_Callback   get_callback,
                    CFF_Decoder_Free_Glyph_Callback  free_callback )
  {
    CFF_Font  cff = (CFF_Font)face->extra.data;


    /* clear everything */
    FT_ZERO( decoder );

    /* initialize builder */
    cff_builder_init( &decoder->builder, face, size, slot, hinting );

    /* initialize Type2 decoder */
    decoder->cff          = cff;
    decoder->num_globals  = cff->global_subrs_index.count;
    decoder->globals      = cff->global_subrs;
    decoder->globals_bias = cff_compute_bias(
                              cff->top_font.font_dict.charstring_type,
                              decoder->num_globals );

    decoder->hint_mode = hint_mode;

    decoder->get_glyph_callback  = get_callback;
    decoder->free_glyph_callback = free_callback;
  }